

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::SetHasHotLoop(FunctionBody *this)

{
  if (((*(uint *)&this->field_0x178 >> 0xe & 1) == 0) &&
     (*(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 | 0x4000, DAT_015bbe38 == '\0')) {
    FunctionExecutionStateMachine::CommitExecutedIterations(&this->executionState);
    TraceExecutionMode(this,"HasHotLoop (before)");
    if (1 < (this->executionState).fullJitThreshold) {
      FunctionExecutionStateMachine::SetFullJitThreshold(&this->executionState,1,true);
    }
    TraceExecutionMode(this,"HasHotLoop");
    return;
  }
  return;
}

Assistant:

void FunctionBody::SetHasHotLoop()
    {
        if(hasHotLoop)
        {
            return;
        }
        hasHotLoop = true;

        if(Configuration::Global.flags.EnforceExecutionModeLimits)
        {
            return;
        }

        executionState.CommitExecutedIterations();
        TraceExecutionMode("HasHotLoop (before)");
        if(executionState.GetFullJitThreshold() > 1)
        {
            executionState.SetFullJitThreshold(1, true);
        }
        TraceExecutionMode("HasHotLoop");
    }